

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O2

void __thiscall index_tree::create_index_tree(index_tree *this)

{
  int local_44;
  index_tree *local_40;
  shared_ptr<index> idx;
  
  for (local_44 = 1; local_44 < 0x15; local_44 = local_44 + 1) {
    local_40 = this;
    std::make_shared<index,int&,index_tree*>((int *)&idx,(index_tree **)&local_44);
    std::vector<std::shared_ptr<index>,std::allocator<std::shared_ptr<index>>>::
    emplace_back<std::shared_ptr<index>&>
              ((vector<std::shared_ptr<index>,std::allocator<std::shared_ptr<index>>> *)this,&idx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&idx.super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void index_tree::create_index_tree()
{
	for (int i = 1; i <= max_index_level; ++i)
	{
		auto idx = std::make_shared<index>(i, this);
		indexes_.emplace_back(idx);
	}
}